

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O3

uint aom_highbd_8_obmc_variance4x8_c
               (uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  int *piVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  ulong *puVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  puVar7 = (ulong *)((long)pre * 2);
  lVar8 = 0;
  iVar9 = 0;
  uVar10 = 0;
  do {
    piVar1 = (int *)((long)wsrc + lVar8);
    auVar11 = *(undefined1 (*) [16])((long)mask + lVar8);
    uVar2 = *puVar7;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar2;
    auVar3._12_2_ = (short)(uVar2 >> 0x30);
    auVar4._8_2_ = (short)(uVar2 >> 0x20);
    auVar4._0_8_ = uVar2;
    auVar4._10_4_ = auVar3._10_4_;
    auVar6._6_8_ = 0;
    auVar6._0_6_ = auVar4._8_6_;
    auVar5._4_2_ = (short)(uVar2 >> 0x10);
    auVar5._0_4_ = (uint)uVar2;
    auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
    iVar12 = *piVar1 - auVar11._0_4_ * ((uint)uVar2 & 0xffff);
    iVar14 = piVar1[1] - auVar5._4_4_ * auVar11._4_4_;
    iVar15 = piVar1[2] - (int)((auVar11._8_8_ & 0xffffffff) * ((ulong)auVar4._8_6_ & 0xffffffff));
    iVar16 = piVar1[3] - (auVar3._10_4_ >> 0x10) * auVar11._12_4_;
    auVar11._0_4_ = -(uint)(iVar12 < 0);
    auVar11._4_4_ = -(uint)(iVar14 < 0);
    auVar11._8_4_ = -(uint)(iVar15 < 0);
    auVar11._12_4_ = -(uint)(iVar16 < 0);
    auVar18._4_4_ = -(0x800U - iVar14 >> 0xc);
    auVar18._0_4_ = -(0x800U - iVar12 >> 0xc);
    auVar18._8_4_ = -(0x800U - iVar15 >> 0xc);
    auVar18._12_4_ = -(0x800U - iVar16 >> 0xc);
    auVar13._0_4_ = iVar12 + 0x800U >> 0xc;
    auVar13._4_4_ = iVar14 + 0x800U >> 0xc;
    auVar13._8_4_ = iVar15 + 0x800U >> 0xc;
    auVar13._12_4_ = iVar16 + 0x800U >> 0xc;
    auVar11 = ~auVar11 & auVar13 | auVar18 & auVar11;
    iVar15 = auVar11._0_4_;
    iVar12 = auVar11._4_4_;
    iVar14 = auVar11._12_4_;
    auVar17._4_4_ = iVar12;
    auVar17._0_4_ = iVar12;
    auVar17._8_4_ = iVar14;
    auVar17._12_4_ = iVar14;
    iVar9 = iVar14 + iVar12 + auVar11._8_4_ + iVar15 + iVar9;
    uVar10 = (int)((auVar17._8_8_ & 0xffffffff) * (auVar17._8_8_ & 0xffffffff)) + iVar12 * iVar12 +
             (int)((auVar11._8_8_ & 0xffffffff) * (ulong)auVar11._8_4_) + iVar15 * iVar15 + uVar10;
    lVar8 = lVar8 + 0x10;
    puVar7 = (ulong *)((long)puVar7 + (long)pre_stride * 2);
  } while ((int)lVar8 != 0x80);
  *sse = uVar10;
  return uVar10 - (int)((ulong)((long)iVar9 * (long)iVar9) >> 5);
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}